

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_common.c
# Opt level: O1

EGLDisplay get_egl_display_or_skip(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  EGLDisplay pvVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  EGLint minor;
  EGLint major;
  undefined1 local_10 [4];
  undefined1 local_c [4];
  
  lVar3 = XOpenDisplay(0);
  if (lVar3 == 0) {
    pcVar6 = "couldn\'t open display\n";
    uVar7 = 0x4d;
  }
  else {
    pvVar4 = (EGLDisplay)(*_epoxy_eglGetDisplay)(lVar3);
    if (pvVar4 == (EGLDisplay)0x0) {
      pcVar6 = "Couldn\'t get EGL display for X11 Display.\n";
    }
    else {
      iVar2 = (*_epoxy_eglInitialize)(pvVar4,local_c,local_10);
      if (iVar2 != 0) {
        return pvVar4;
      }
      pcVar6 = "eglInitialize() failed\n";
    }
    uVar7 = 1;
  }
  errx(uVar7,pcVar6);
  pvVar4 = get_egl_display_or_skip();
  pcVar6 = (char *)(*_epoxy_eglQueryString)(pvVar4,0x3055);
  pcVar5 = strchr(pcVar6,0x20);
  if (pcVar5 == (char *)0x0) {
    pcVar6 = strdup(pcVar6);
  }
  else {
    pcVar6 = strndup(pcVar6,(long)pcVar5 - (long)pcVar6);
  }
  cVar1 = epoxy_has_egl_extension(pvVar4,pcVar6);
  if (cVar1 == '\0') {
    errx(1,"Implementation reported absence of %s",pcVar6);
  }
  else {
    free(pcVar6);
    cVar1 = epoxy_has_egl_extension(pvVar4,"GLX_ARB_ham_sandwich");
    if (cVar1 == '\0') {
      return (EGLDisplay)0x0;
    }
  }
  errx(1,"Implementation reported presence of GLX_ARB_ham_sandwich");
  halt_baddata();
}

Assistant:

EGLDisplay 
get_egl_display_or_skip(void)
{
    Display *dpy = XOpenDisplay(NULL);
    EGLint major, minor;
    EGLDisplay edpy;
    bool ok;

    if (!dpy)
        errx(77, "couldn't open display\n");
    edpy = eglGetDisplay((EGLNativeDisplayType)dpy);
    if (edpy == EGL_NO_DISPLAY)
        errx(1, "Couldn't get EGL display for X11 Display.\n");

    ok = eglInitialize(edpy, &major, &minor);
    if (!ok)
        errx(1, "eglInitialize() failed\n");

    return edpy;
}